

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

void Assimp::ExportScene3DS
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  DeadlyImportError *this;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  shared_ptr<Assimp::IOStream> outfile;
  SplitLargeMeshesProcess_Triangle tri_splitter;
  SplitLargeMeshesProcess_Vertex vert_splitter;
  Discreet3DSExporter exporter;
  
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&outfile,
             (IOStream *)CONCAT44(extraout_var,iVar1));
  if (outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    SceneCombiner::CopyScene(&scenecopy_tmp,pScene,true);
    scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
    super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
    super__Head_base<0UL,_aiScene_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiScene,_std::default_delete<aiScene>,_true,_true>)
         (__uniq_ptr_data<aiScene,_std::default_delete<aiScene>,_true,_true>)scenecopy_tmp;
    SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle(&tri_splitter);
    tri_splitter.LIMIT = 0xffff;
    SplitLargeMeshesProcess_Triangle::Execute(&tri_splitter,scenecopy_tmp);
    SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex(&vert_splitter);
    vert_splitter.LIMIT = 0xffff;
    SplitLargeMeshesProcess_Vertex::Execute
              (&vert_splitter,
               (aiScene *)
               scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
               super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
               super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    Discreet3DSExporter::Discreet3DSExporter
              (&exporter,&outfile,
               (aiScene *)
               scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
               super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
               super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    Discreet3DSExporter::~Discreet3DSExporter(&exporter);
    SplitLargeMeshesProcess_Vertex::~SplitLargeMeshesProcess_Vertex(&vert_splitter);
    SplitLargeMeshesProcess_Triangle::~SplitLargeMeshesProcess_Triangle(&tri_splitter);
    std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr(&scenecopy);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&outfile.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    return;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tri_splitter,pFile,(allocator<char> *)&vert_splitter);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exporter,
                 "Could not open output .3ds file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri_splitter)
  ;
  DeadlyImportError::DeadlyImportError(this,(string *)&exporter);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportScene3DS(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    std::shared_ptr<IOStream> outfile (pIOSystem->Open(pFile, "wb"));
    if(!outfile) {
        throw DeadlyExportError("Could not open output .3ds file: " + std::string(pFile));
    }

    // TODO: This extra copy should be avoided and all of this made a preprocess
    // requirement of the 3DS exporter.
    //
    // 3DS meshes can be max 0xffff (16 Bit) vertices and faces, respectively.
    // SplitLargeMeshes can do this, but it requires the correct limit to be set
    // which is not possible with the current way of specifying preprocess steps
    // in |Exporter::ExportFormatEntry|.
    aiScene* scenecopy_tmp;
    SceneCombiner::CopyScene(&scenecopy_tmp,pScene);
    std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);

    SplitLargeMeshesProcess_Triangle tri_splitter;
    tri_splitter.SetLimit(0xffff);
    tri_splitter.Execute(scenecopy.get());

    SplitLargeMeshesProcess_Vertex vert_splitter;
    vert_splitter.SetLimit(0xffff);
    vert_splitter.Execute(scenecopy.get());

    // Invoke the actual exporter
    Discreet3DSExporter exporter(outfile, scenecopy.get());
}